

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::replace(UnicodeString *this,int32_t start,int32_t _length,UChar32 srcChar)

{
  bool bVar1;
  UnicodeString *pUVar2;
  int32_t local_44;
  int32_t local_24;
  UChar local_20;
  ushort uStack_1e;
  UBool isError;
  int32_t count;
  UChar buffer [2];
  UChar32 srcChar_local;
  int32_t _length_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  local_24 = 0;
  bVar1 = false;
  if ((uint)srcChar < 0x10000) {
    local_24 = 1;
    local_20 = (UChar)srcChar;
  }
  else {
    bVar1 = 0x10ffff < (uint)srcChar;
    if (!bVar1) {
      local_20 = (short)(srcChar >> 10) + L'ퟀ';
      uStack_1e = (UChar)srcChar & 0x3ffU | 0xdc00;
      local_24 = 2;
    }
  }
  if (bVar1) {
    local_44 = 0;
  }
  else {
    local_44 = local_24;
  }
  count = srcChar;
  buffer = (UChar  [2])_length;
  pUVar2 = doReplace(this,start,_length,&local_20,0,local_44);
  return pUVar2;
}

Assistant:

UnicodeString&
UnicodeString::replace(int32_t start,
               int32_t _length,
               UChar32 srcChar) {
  UChar buffer[U16_MAX_LENGTH];
  int32_t count = 0;
  UBool isError = FALSE;
  U16_APPEND(buffer, count, U16_MAX_LENGTH, srcChar, isError);
  // We test isError so that the compiler does not complain that we don't.
  // If isError (srcChar is not a valid code point) then count==0 which means
  // we remove the source segment rather than replacing it with srcChar.
  return doReplace(start, _length, buffer, 0, isError ? 0 : count);
}